

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicCpuInfo.cpp
# Opt level: O0

void __thiscall xmrig::BasicCpuInfo::BasicCpuInfo(BasicCpuInfo *this)

{
  bool bVar1;
  uint uVar2;
  ICpuInfo *in_RDI;
  char *in_stack_00000020;
  
  ICpuInfo::ICpuInfo(in_RDI);
  in_RDI->_vptr_ICpuInfo = (_func_int **)&PTR__BasicCpuInfo_002b8b00;
  in_RDI[7]._vptr_ICpuInfo = (_func_int **)0x0;
  in_RDI[8]._vptr_ICpuInfo = (_func_int **)0x0;
  in_RDI[5]._vptr_ICpuInfo = (_func_int **)0x0;
  in_RDI[6]._vptr_ICpuInfo = (_func_int **)0x0;
  in_RDI[3]._vptr_ICpuInfo = (_func_int **)0x0;
  in_RDI[4]._vptr_ICpuInfo = (_func_int **)0x0;
  in_RDI[1]._vptr_ICpuInfo = (_func_int **)0x0;
  in_RDI[2]._vptr_ICpuInfo = (_func_int **)0x0;
  *(undefined8 *)((long)&in_RDI[8]._vptr_ICpuInfo + 6) = 0;
  uVar2 = std::thread::hardware_concurrency();
  in_RDI[10]._vptr_ICpuInfo = (_func_int **)(ulong)uVar2;
  Assembly::Assembly((Assembly *)(in_RDI + 0xb),NONE);
  bVar1 = has_aes_ni();
  *(bool *)((long)&in_RDI[0xb]._vptr_ICpuInfo + 4) = bVar1;
  bVar1 = has_avx2();
  *(bool *)((long)&in_RDI[0xb]._vptr_ICpuInfo + 5) = bVar1;
  cpu_brand_string(in_stack_00000020);
  return;
}

Assistant:

xmrig::BasicCpuInfo::BasicCpuInfo() :
    m_brand(),
    m_threads(std::thread::hardware_concurrency()),
    m_assembly(Assembly::NONE),
    m_aes(has_aes_ni()),
    m_avx2(has_avx2())
{
    cpu_brand_string(m_brand);
}